

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O0

void __thiscall iDynTree::DummyLight::~DummyLight(DummyLight *this)

{
  DummyLight *in_RDI;
  
  ~DummyLight(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~DummyLight() {}